

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool __thiscall grammar::is_terminal_symbol(grammar *this,symbol_t *symbol)

{
  bool bVar1;
  _Base_ptr p_Var2;
  size_type sVar3;
  
  p_Var2 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->symbols)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
    bVar1 = operator==((this_t *)&p_Var2[1]._M_parent,symbol);
    if (bVar1) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  sVar3 = std::
          map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
          ::count(&this->rules,(key_type *)(p_Var2 + 1));
  if (sVar3 != 0) {
    return false;
  }
  bVar1 = using_symbol(this,symbol);
  return bVar1;
}

Assistant:

[[maybe_unused]] bool grammar::is_terminal_symbol(symbol_t symbol) const {
    if (auto iter = std::find_if(
            symbols.begin(), symbols.end(),
            [&symbol](auto & entry) { return entry.second == symbol; });
        iter != symbols.end())
        return this->rules.count(iter->first) == 0
               and this->using_symbol(symbol);
    else
        return false;
}